

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O2

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Valid::test_method
          (IsPayToWitnessScriptHash_Valid *this)

{
  long lVar1;
  readonly_property65 rVar2;
  CScript *this_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  check_type cVar5;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  assertion_result local_138;
  char **local_120;
  assertion_result local_118;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  CScript p2wsh;
  uint256 dummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dummy.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  p2wsh.super_CScriptBase._union._16_8_ = 0;
  p2wsh.super_CScriptBase._24_8_ = 0;
  p2wsh.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  p2wsh.super_CScriptBase._union._8_8_ = 0;
  this_00 = CScript::operator<<(&p2wsh,OP_0);
  ToByteVector<uint256>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,&dummy);
  b._M_extent._M_extent_value = CONCAT71(local_98._9_7_,local_98[8]) - local_98._0_8_;
  b._M_ptr = (pointer)local_98._0_8_;
  CScript::operator<<(this_00,b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x11;
  file.m_begin = (iterator)&local_a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToWitnessScriptHash(&p2wsh);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = &bytes;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "p2wsh.IsPayToWitnessScriptHash()";
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_0113a070;
  local_98._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_98,1,0,WARN,_cVar5,(size_t)&local_c8,0x11);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_98._0_2_ = 0x2000;
  __l._M_len = 2;
  __l._M_array = local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bytes,__l,(allocator_type *)&local_138);
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&bytes,(const_iterator)
                    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish,0x20,local_98);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x15;
  file_00.m_begin = (iterator)&local_f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToWitnessScriptHash((CScript *)local_98);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = &local_148;
  local_148 = "CScript(bytes.begin(), bytes.end()).IsPayToWitnessScriptHash()";
  local_140 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&local_138,1,0,WARN,_cVar5,(size_t)&local_158,0x15);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2wsh.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Valid)
{
    uint256 dummy;
    CScript p2wsh;
    p2wsh << OP_0 << ToByteVector(dummy);
    BOOST_CHECK(p2wsh.IsPayToWitnessScriptHash());

    std::vector<unsigned char> bytes = {OP_0, 32};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(CScript(bytes.begin(), bytes.end()).IsPayToWitnessScriptHash());
}